

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlXIncludeRefPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  char *pcVar8;
  int iVar9;
  char *extra;
  xmlNodePtr cur;
  _xmlNode *p_Var10;
  _xmlNode *p_Var11;
  long lVar12;
  
  iVar9 = ctxt->incNr;
  lVar12 = (long)iVar9;
  p_Var11 = tree;
  do {
    if ((((p_Var11 == (xmlNodePtr)0x0) || (p_Var11->type != XML_ELEMENT_NODE)) ||
        (p_Var11->ns == (xmlNs *)0x0)) ||
       ((iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar2 == 0 &&
        (iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar2 == 0)))) {
LAB_001b9163:
      if ((p_Var11->children == (xmlNodePtr)0x0) ||
         (pxVar6 = p_Var11->children, (p_Var11->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
      goto LAB_001b9178;
    }
    else {
      iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
      if ((iVar2 != 0) && (ctxt->legacy == 0)) {
        ctxt->legacy = 1;
      }
      iVar2 = xmlStrEqual(p_Var11->name,(xmlChar *)"include");
      if (iVar2 == 0) {
        iVar2 = xmlStrEqual(p_Var11->name,(xmlChar *)"fallback");
        if ((iVar2 != 0) &&
           (((p_Var10 = p_Var11->parent, p_Var10 == (_xmlNode *)0x0 ||
             (p_Var10->type != XML_ELEMENT_NODE)) ||
            ((p_Var10->ns == (xmlNs *)0x0 ||
             (((iVar2 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
               iVar2 == 0 &&
               (iVar2 = xmlStrEqual(p_Var11->parent->ns->href,
                                    (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar2 == 0)) ||
              (iVar2 = xmlStrEqual(p_Var11->parent->name,(xmlChar *)"include"), iVar2 == 0)))))))) {
          iVar2 = 0x650;
          pcVar8 = "%s is not the child of an \'include\'\n";
          extra = "fallback";
LAB_001b915e:
          xmlXIncludeErr(ctxt,p_Var11,iVar2,pcVar8,(xmlChar *)extra);
        }
        goto LAB_001b9163;
      }
      p_Var10 = p_Var11->children;
      if (p_Var10 != (_xmlNode *)0x0) {
        iVar2 = 0;
        do {
          if (((p_Var10->type == XML_ELEMENT_NODE) && (p_Var10->ns != (xmlNs *)0x0)) &&
             ((iVar3 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
              iVar3 != 0 ||
              (iVar3 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
              iVar3 != 0)))) {
            iVar3 = xmlStrEqual(p_Var10->name,(xmlChar *)"include");
            if (iVar3 != 0) {
              iVar2 = 0x64e;
              pcVar8 = "%s has an \'include\' child\n";
              goto LAB_001b9157;
            }
            iVar3 = xmlStrEqual(p_Var10->name,(xmlChar *)"fallback");
            iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
          }
          p_Var10 = p_Var10->next;
        } while (p_Var10 != (_xmlNode *)0x0);
        if (1 < iVar2) {
          iVar2 = 0x64f;
          pcVar8 = "%s has multiple fallback children\n";
LAB_001b9157:
          extra = "include";
          goto LAB_001b915e;
        }
      }
      pxVar4 = xmlXIncludeExpandNode(ctxt,p_Var11);
      if (pxVar4 != (xmlXIncludeRefPtr)0x0) {
        pxVar4->replace = 1;
      }
LAB_001b9178:
      do {
        pxVar6 = p_Var11;
        if ((p_Var11 == tree) || (pxVar6 = p_Var11->next, p_Var11->next != (xmlNodePtr)0x0))
        goto LAB_001b9196;
        p_Var11 = p_Var11->parent;
      } while (p_Var11 != (_xmlNode *)0x0);
      pxVar6 = (xmlNodePtr)0x0;
    }
LAB_001b9196:
  } while ((pxVar6 != (xmlNodePtr)0x0) && (p_Var11 = pxVar6, pxVar6 != tree));
  iVar2 = 0;
  if (iVar9 < ctxt->incNr) {
    iVar2 = 0;
    do {
      pxVar4 = ctxt->incTab[lVar12];
      if (pxVar4->replace == 0) {
        if (pxVar4->inc != (xmlNodePtr)0x0) {
          xmlFreeNodeList(pxVar4->inc);
          ctxt->incTab[lVar12]->inc = (xmlNodePtr)0x0;
        }
      }
      else {
        if (((pxVar4 != (xmlXIncludeRefPtr)0x0) &&
            (pxVar6 = pxVar4->elem, pxVar6 != (xmlNodePtr)0x0)) &&
           (pxVar6->type != XML_NAMESPACE_DECL)) {
          cur = pxVar4->inc;
          pxVar4->inc = (xmlNodePtr)0x0;
          if ((pxVar6->parent == (_xmlNode *)0x0) || (pxVar6->parent->type == XML_ELEMENT_NODE)) {
LAB_001b927e:
            if ((ctxt->parseFlags & 0x8000) == 0) {
              if (pxVar4->fallback != 0) {
                xmlUnsetProp(pxVar6,"href");
              }
              pxVar6->type = XML_XINCLUDE_START;
              pxVar5 = pxVar6->children;
              while (pxVar5 != (xmlNodePtr)0x0) {
                p_Var11 = pxVar5->next;
                xmlUnlinkNode(pxVar5);
                xmlFreeNode(pxVar5);
                pxVar5 = p_Var11;
              }
              pxVar5 = xmlNewDocNode(pxVar6->doc,pxVar6->ns,pxVar6->name,(xmlChar *)0x0);
              bVar1 = true;
              if (pxVar5 != (xmlNodePtr)0x0) {
                pxVar5->type = XML_XINCLUDE_END;
                pxVar6 = xmlAddNextSibling(pxVar6,pxVar5);
                if (pxVar6 != (xmlNodePtr)0x0) {
                  do {
                    pxVar6 = cur;
                    if (pxVar6 == (xmlNodePtr)0x0) {
                      cur = (xmlNodePtr)0x0;
                      bVar1 = false;
                      goto LAB_001b9388;
                    }
                    cur = pxVar6->next;
                    pxVar7 = xmlAddPrevSibling(pxVar5,pxVar6);
                  } while (pxVar7 != (xmlNodePtr)0x0);
                  xmlUnlinkNode(pxVar6);
                  pxVar5 = pxVar6;
                }
                xmlFreeNode(pxVar5);
                bVar1 = true;
              }
LAB_001b9388:
              if (!bVar1) goto LAB_001b93bc;
            }
            else {
              do {
                pxVar5 = cur;
                if (pxVar5 == (xmlNodePtr)0x0) {
                  xmlUnlinkNode(pxVar6);
                  xmlFreeNode(pxVar6);
                  goto LAB_001b93bc;
                }
                cur = pxVar5->next;
                pxVar7 = xmlAddPrevSibling(pxVar6,pxVar5);
              } while (pxVar7 != (xmlNodePtr)0x0);
              xmlUnlinkNode(pxVar5);
              xmlFreeNode(pxVar5);
            }
            ctxt->fatalErr = 1;
            ctxt->errNo = 2;
            ctxt->nbErrors = ctxt->nbErrors + 1;
            xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                (xmlError *)0x0);
          }
          else {
            iVar9 = 0;
            for (p_Var11 = cur; p_Var11 != (xmlNodePtr)0x0; p_Var11 = p_Var11->next) {
              iVar9 = iVar9 + (uint)(p_Var11->type == XML_ELEMENT_NODE);
            }
            if (iVar9 == 1) goto LAB_001b927e;
            pcVar8 = "XInclude error: would result in multiple root nodes\n";
            if (iVar9 == 0) {
              pcVar8 = "XInclude error: would result in no root node\n";
            }
            xmlXIncludeErr(ctxt,pxVar6,0x64b,pcVar8,(xmlChar *)0x0);
          }
          xmlFreeNodeList(cur);
        }
LAB_001b93bc:
        ctxt->incTab[lVar12]->replace = 0;
      }
      iVar2 = iVar2 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < ctxt->incNr);
  }
  if (ctxt->isStream != 0) {
    if (0 < ctxt->incNr) {
      lVar12 = 0;
      do {
        xmlXIncludeFreeRef(ctxt->incTab[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < ctxt->incNr);
    }
    ctxt->incNr = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}